

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded.cpp
# Opt level: O3

bool __thiscall clickhouse::CodedInputStream::ReadVarint64(CodedInputStream *this,uint64_t *value)

{
  int iVar1;
  long in_RAX;
  undefined4 extraout_var;
  long lVar2;
  bool bVar3;
  bool bVar4;
  uint8_t byte;
  undefined8 uStack_28;
  
  *value = 0;
  lVar2 = 0;
  uStack_28 = in_RAX;
  while( true ) {
    iVar1 = (*(this->input_->super_InputStream)._vptr_InputStream[2])
                      (this->input_,(long)&uStack_28 + 7,1);
    if (CONCAT44(extraout_var,iVar1) != 1) {
      return false;
    }
    *value = *value | (ulong)(uStack_28._7_1_ & 0x7f) << ((byte)lVar2 & 0x3f);
    bVar4 = -1 < uStack_28;
    if (bVar4) break;
    bVar3 = lVar2 == 0x3f;
    lVar2 = lVar2 + 7;
    if (bVar3) {
      return bVar4;
    }
  }
  return bVar4;
}

Assistant:

bool CodedInputStream::ReadVarint64(uint64_t* value) {
    *value = 0;

    for (size_t i = 0; i < MAX_VARINT_BYTES; ++i) {
        uint8_t byte;

        if (!input_->ReadByte(&byte)) {
            return false;
        } else {
            *value |= uint64_t(byte & 0x7F) << (7 * i);

            if (!(byte & 0x80)) {
                return true;
            }
        }
    }

    // TODO skip invalid
    return false;
}